

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CodeGeneratorTest_BuildFeatureSetDefaultsUnsupported_Test>
::CreateTest(TestFactoryImpl<google::protobuf::compiler::(anonymous_namespace)::CodeGeneratorTest_BuildFeatureSetDefaultsUnsupported_Test>
             *this)

{
  CodeGeneratorTest *this_00;
  
  this_00 = (CodeGeneratorTest *)operator_new(0x88);
  google::protobuf::compiler::anon_unknown_0::CodeGeneratorTest::CodeGeneratorTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__CodeGeneratorTest_016441d8;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }